

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O3

bool __thiscall
draco::PlyReader::ParseElementDataAscii(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  PlyProperty *property;
  function<void_(double)> *pfVar1;
  iterator iVar2;
  bool bVar3;
  pointer pPVar4;
  undefined8 uVar5;
  int64_t iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int32_t num_entries;
  float val;
  PlyPropertyWriter<double> prop_writer;
  int32_t local_78;
  float local_74;
  double local_70;
  PlyPropertyWriter<double> local_68;
  ulong local_40;
  pointer local_38;
  
  local_38 = (this->elements_).
             super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar6 = local_38[element_index].num_entries_;
  if (0 < (int)iVar6) {
    local_38 = local_38 + element_index;
    lVar8 = *(long *)&(local_38->properties_).
                      super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                      _M_impl;
    pPVar4 = *(pointer *)
              ((long)&(local_38->properties_).
                      super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_> +
              8);
    local_40 = 0;
    do {
      if (0 < (int)((ulong)((long)pPVar4 - lVar8) >> 5) * -0x55555555) {
        lVar9 = 0;
        do {
          property = (PlyProperty *)(lVar8 + lVar9 * 0x60);
          PlyPropertyWriter<double>::PlyPropertyWriter(&local_68,property);
          local_78 = 1;
          pfVar1 = &local_68.convert_value_func_;
          if (*(int *)(lVar8 + 0x58 + lVar9 * 0x60) == 0) {
LAB_00119d4f:
            iVar7 = 0;
            do {
              parser::SkipWhitespace(buffer);
              if (property->data_type_ - DT_FLOAT32 < 2) {
                bVar3 = parser::ParseFloat(buffer,&local_74);
                if (!bVar3) {
LAB_00119e40:
                  if (local_68.convert_value_func_.super__Function_base._M_manager ==
                      (_Manager_type)0x0) {
                    return false;
                  }
                  (*local_68.convert_value_func_.super__Function_base._M_manager)
                            ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
                  return false;
                }
                local_70 = (double)local_74;
                if (local_68.convert_value_func_.super__Function_base._M_manager ==
                    (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
LAB_00119e86:
                  uVar5 = std::__throw_bad_function_call();
                  __clang_call_terminate(uVar5);
                }
                (*local_68.convert_value_func_._M_invoker)((_Any_data *)pfVar1,&local_70);
              }
              else {
                bVar3 = parser::ParseSignedInt(buffer,(int32_t *)&local_74);
                if (!bVar3) goto LAB_00119e40;
                local_70 = (double)(int)local_74;
                if (local_68.convert_value_func_.super__Function_base._M_manager ==
                    (_Manager_type)0x0) goto LAB_00119e86;
                (*local_68.convert_value_func_._M_invoker)((_Any_data *)pfVar1,&local_70);
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < local_78);
          }
          else {
            parser::SkipWhitespace(buffer);
            bVar3 = parser::ParseSignedInt(buffer,&local_78);
            if (!bVar3) {
              if (local_68.convert_value_func_.super__Function_base._M_manager != (_Manager_type)0x0
                 ) {
                (*local_68.convert_value_func_.super__Function_base._M_manager)
                          ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
              }
              return false;
            }
            local_70 = (double)((ulong)((long)(property->data_).
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(property->data_).
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start) /
                               (ulong)(long)property->data_type_num_bytes_);
            iVar2._M_current =
                 (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&property->list_data_,iVar2,(long *)&local_70);
            }
            else {
              *iVar2._M_current = (long)local_70;
              (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            local_70 = (double)(long)local_78;
            iVar2._M_current =
                 (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&property->list_data_,iVar2,(long *)&local_70);
            }
            else {
              *iVar2._M_current = (long)local_70;
              (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            if (0 < local_78) goto LAB_00119d4f;
          }
          if (local_68.convert_value_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_68.convert_value_func_.super__Function_base._M_manager)
                      ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
          }
          lVar9 = lVar9 + 1;
          lVar8 = *(long *)&(local_38->properties_).
                            super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                            ._M_impl;
          pPVar4 = *(pointer *)
                    ((long)&(local_38->properties_).
                            super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                    + 8);
        } while (lVar9 < (int)((ulong)((long)pPVar4 - lVar8) >> 5) * -0x55555555);
        iVar6 = local_38->num_entries_;
      }
      uVar10 = (int)local_40 + 1;
      local_40 = (ulong)uVar10;
    } while ((int)uVar10 < (int)iVar6);
  }
  return true;
}

Assistant:

bool PlyReader::ParseElementDataAscii(DecoderBuffer *buffer,
                                      int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      PlyPropertyWriter<double> prop_writer(&prop);
      int32_t num_entries = 1;
      if (prop.is_list()) {
        parser::SkipWhitespace(buffer);
        // Parse the number of entries for the list element.
        if (!parser::ParseSignedInt(buffer, &num_entries)) {
          return false;
        }

        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
      }
      // Read and store the actual property data.
      for (int v = 0; v < num_entries; ++v) {
        parser::SkipWhitespace(buffer);
        if (prop.data_type() == DT_FLOAT32 || prop.data_type() == DT_FLOAT64) {
          float val;
          if (!parser::ParseFloat(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        } else {
          int32_t val;
          if (!parser::ParseSignedInt(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        }
      }
    }
  }
  return true;
}